

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O3

bool ActionInferTypes::propagateTypeEdge(TypeFactory *typegrp,PcodeOp *op,int4 inslot,int4 outslot)

{
  uint uVar1;
  OpCode OVar2;
  Varnode *pVVar3;
  ValueSet *pVVar4;
  AddrSpace *pAVar5;
  bool bVar6;
  int iVar7;
  Varnode **ppVVar8;
  Datatype *pt;
  ValueSet *pt_00;
  uint4 ws;
  int4 iVar9;
  Varnode *pVVar10;
  
  if (outslot == -1) {
    ppVVar8 = &op->output;
  }
  else {
    ppVVar8 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start + outslot;
  }
  pVVar3 = *ppVVar8;
  uVar1 = pVVar3->flags;
  if ((uVar1 & 0x104) != 0) {
    return false;
  }
  if (inslot == -1) {
    pVVar10 = op->output;
    iVar9 = -1;
  }
  else {
    pVVar10 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start[inslot];
    iVar9 = inslot;
  }
  bVar6 = propagateGoodEdge(op,iVar9,outslot,pVVar10);
  if (!bVar6) {
    return false;
  }
  pt_00 = (pVVar10->temp).valueSet;
  OVar2 = op->opcode->opcode;
  switch(OVar2) {
  case CPUI_COPY:
  case CPUI_INT_EQUAL:
  case CPUI_INT_NOTEQUAL:
  case CPUI_INT_LESS:
  case CPUI_INT_LESSEQUAL:
    goto switchD_002e90f2_caseD_3c;
  case CPUI_LOAD:
    if (inslot == -1) goto LAB_002e91a4;
LAB_002e912a:
    if (*(int *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)&pt_00->range + 1) == 2) {
      pVVar4 = (ValueSet *)
               (pt_00->equations).
               super__Vector_base<ValueSet::Equation,_std::allocator<ValueSet::Equation>_>._M_impl.
               super__Vector_impl_data._M_start;
      pt_00 = (ValueSet *)(pVVar3->temp).dataType;
      if (pVVar4->count == ((ValueSet *)(pVVar3->temp).dataType)->count) {
        pt_00 = pVVar4;
      }
    }
    else {
      pt_00 = (ValueSet *)(pVVar3->temp).dataType;
    }
    break;
  case CPUI_STORE:
    if (inslot != 2) goto LAB_002e912a;
LAB_002e91a4:
    pt_00 = (ValueSet *)
            TypeFactory::getTypePointerNoDepth
                      (typegrp,((pVVar3->temp).dataType)->size,(Datatype *)pt_00,
                       *(uint4 *)(((*(op->inrefs).
                                     super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->loc).offset + 0x5c))
    ;
    break;
  case CPUI_BRANCH:
  case CPUI_CBRANCH:
  case CPUI_BRANCHIND:
  case CPUI_CALL:
  case CPUI_CALLIND:
  case CPUI_CALLOTHER:
  case CPUI_RETURN:
  case CPUI_INT_SLESS:
  case CPUI_INT_SLESSEQUAL:
  case CPUI_INT_ZEXT:
  case CPUI_INT_SEXT:
    goto switchD_002e90f2_caseD_3e;
  case CPUI_INT_ADD:
    if (((uVar1 & 2) == 0) ||
       (*(int *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)&pt_00->range + 1) == 2)) {
switchD_002e90f2_caseD_41:
      if (inslot == -1) {
        pt_00 = (ValueSet *)
                ((op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                 super__Vector_impl_data._M_start[outslot]->temp).dataType;
      }
      else {
        pt_00 = (ValueSet *)propagateAddIn2Out(typegrp,op,inslot);
      }
    }
    break;
  default:
    switch(OVar2) {
    case CPUI_MULTIEQUAL:
    case CPUI_INDIRECT:
      goto switchD_002e90f2_caseD_3c;
    case CPUI_PIECE:
    case CPUI_SUBPIECE:
    case CPUI_CAST:
    case CPUI_CPOOLREF:
      goto switchD_002e90f2_caseD_3e;
    case CPUI_PTRADD:
    case CPUI_PTRSUB:
      goto switchD_002e90f2_caseD_41;
    case CPUI_SEGMENTOP:
      pt = (Datatype *)
           (pt_00->equations).
           super__Vector_base<ValueSet::Equation,_std::allocator<ValueSet::Equation>_>._M_impl.
           super__Vector_impl_data._M_start;
      iVar9 = pVVar3->size;
      ws = ((typegrp->glb->super_AddrSpaceManager).defaultspace)->wordsize;
      goto LAB_002e9198;
    case CPUI_NEW:
      pVVar10 = *(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if ((pVVar10->flags & 0x10) == 0) {
        return false;
      }
      if (pVVar10->def->opcode->opcode != CPUI_CPOOLREF) {
        return false;
      }
      break;
    default:
      if (2 < OVar2 - CPUI_INT_XOR) {
        return false;
      }
switchD_002e90f2_caseD_3c:
      if ((pVVar10->flags & 0x40000) != 0) {
        pAVar5 = (typegrp->glb->super_AddrSpaceManager).defaultspace;
        iVar9 = pt_00->count;
        pt = TypeFactory::getBase(typegrp,1,TYPE_UNKNOWN);
        ws = pAVar5->wordsize;
LAB_002e9198:
        pt_00 = (ValueSet *)TypeFactory::getTypePointer(typegrp,iVar9,pt,ws);
      }
    }
  }
  if ((pt_00 != (ValueSet *)(pVVar3->temp).dataType) &&
     (iVar7 = (**(code **)(*(long *)pt_00 + 0x40))(pt_00,(ValueSet *)(pVVar3->temp).dataType,10),
     iVar7 < 0)) {
    (pVVar3->temp).valueSet = pt_00;
    return (pVVar3->flags & 1) == 0;
  }
switchD_002e90f2_caseD_3e:
  return false;
}

Assistant:

bool ActionInferTypes::propagateTypeEdge(TypeFactory *typegrp,PcodeOp *op,int4 inslot,int4 outslot)
  
{
  Varnode *invn,*outvn;
  Datatype *newtype;

  outvn = (outslot==-1) ? op->getOut() : op->getIn(outslot);
  if (outvn->isAnnotation()) return false;
  if (outvn->isTypeLock()) return false; // Can't propagate through typelock
  invn = (inslot==-1) ? op->getOut() : op->getIn(inslot);
  Datatype *alttype = invn->getTempType();
  if (!propagateGoodEdge(op,inslot,outslot,invn))
    return false;

  switch(op->code()) {
  case CPUI_INDIRECT:
  case CPUI_COPY:
  case CPUI_MULTIEQUAL:
  case CPUI_INT_LESS:
  case CPUI_INT_LESSEQUAL:
  case CPUI_INT_EQUAL:
  case CPUI_INT_NOTEQUAL:
  case CPUI_INT_AND:
  case CPUI_INT_OR:
  case CPUI_INT_XOR:
    if (invn->isSpacebase()) {
      AddrSpace *spc = typegrp->getArch()->getDefaultSpace();
      newtype = typegrp->getTypePointer(alttype->getSize(),typegrp->getBase(1,TYPE_UNKNOWN),spc->getWordSize());
    }
    else
      newtype = alttype;
    break;
  case CPUI_NEW:
    {
      Varnode *invn = op->getIn(0);
      if (!invn->isWritten()) return false;		// Don't propagate
      if (invn->getDef()->code() != CPUI_CPOOLREF) return false;
      newtype = alttype;		// Propagate cpool result as result of new operator
    }
    break;
  case CPUI_SEGMENTOP:
    {
      AddrSpace *spc = typegrp->getArch()->getDefaultSpace();
      Datatype *btype = ((TypePointer *)alttype)->getPtrTo();
      newtype = typegrp->getTypePointer(outvn->getSize(),btype,spc->getWordSize());
    }
    break;
  case CPUI_LOAD:
    if (inslot == -1) {	 // Propagating output to input (value to ptr)
      AddrSpace *spc = Address::getSpaceFromConst(op->getIn(0)->getAddr());
      newtype = typegrp->getTypePointerNoDepth(outvn->getTempType()->getSize(),alttype,spc->getWordSize());
    }
    else if (alttype->getMetatype()==TYPE_PTR) {
      newtype = ((TypePointer *)alttype)->getPtrTo();
      if (newtype->getSize() != outvn->getTempType()->getSize()) // Size must be appropriate
	newtype = outvn->getTempType();
    }
    else
      newtype = outvn->getTempType(); // Don't propagate anything
    break;
  case CPUI_STORE:
    if (inslot==2) {		// Propagating value to ptr
      AddrSpace *spc = Address::getSpaceFromConst(op->getIn(0)->getAddr());
      newtype = typegrp->getTypePointerNoDepth(outvn->getTempType()->getSize(),alttype,spc->getWordSize());
    }
    else if (alttype->getMetatype()==TYPE_PTR) {
      newtype = ((TypePointer *)alttype)->getPtrTo();
      if (newtype->getSize() != outvn->getTempType()->getSize())
	newtype = outvn->getTempType();
    }
    else
      newtype = outvn->getTempType(); // Don't propagate anything
    break;
  case CPUI_PTRADD:
  case CPUI_PTRSUB:
    if (inslot == -1)		// Propagating output to input
      newtype = op->getIn(outslot)->getTempType();	// Don't propagate pointer types this direction
    else
      newtype = propagateAddIn2Out(typegrp,op,inslot);
    break;
  case CPUI_INT_ADD:
    if (outvn->isConstant() && (alttype->getMetatype() != TYPE_PTR))
      newtype = alttype;
    else if (inslot == -1)		// Propagating output to input
      newtype = op->getIn(outslot)->getTempType();	// Don't propagate pointer types this direction
    else
      newtype = propagateAddIn2Out(typegrp,op,inslot);
    break;
  default:
    return false;		// Don't propagate along this edge
  }
  if (0>newtype->typeOrder(*outvn->getTempType())) {
#ifdef TYPEPROP_DEBUG
    propagationDebug(typegrp->getArch(),outvn,newtype,op,inslot,(Varnode *)0);
#endif
    outvn->setTempType(newtype);
    return !outvn->isMark();
  }
  return false;
}